

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall Logger::flush(Logger *this)

{
  FILE *__stream;
  undefined8 uVar1;
  fpos<__mbstate_t> local_78 [2];
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [32];
  Logger *local_10;
  Logger *this_local;
  
  __stream = _stderr;
  if (((int)enabled_level <= (int)this->m_level) && ((this->m_empty & 1U) == 0)) {
    local_10 = this;
    std::__cxx11::ostringstream::str();
    uVar1 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s",uVar1);
    std::__cxx11::string::~string(local_30);
    fflush(_stderr);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,"",&local_51);
    std::__cxx11::ostringstream::str((string *)&this->os);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    std::ios::clear(&this->os + *(long *)(*(long *)&this->os + -0x18),0);
    std::fpos<__mbstate_t>::fpos(local_78,0);
    std::ostream::seekp(&this->os,local_78[0]._M_off,local_78[0]._M_state);
    this->m_empty = true;
  }
  return;
}

Assistant:

void Logger::flush() {
    if ((m_level >= enabled_level) && !m_empty) {
        fprintf(stderr, "%s", os.str().c_str());
        fflush(stderr);
        os.str("");
        os.clear();
        os.seekp(0);
        m_empty = true;
    }
}